

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkLock::IntToDescriptor
          (ChLinkLock *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ChLinkMaskLF *this_00;
  ChConstraintTwoBodies *pCVar1;
  CoeffReturnType pdVar2;
  int i;
  int iVar3;
  int iVar4;
  ChLinkLimit *pCVar5;
  
  this_00 = &this->mask;
  iVar4 = 0;
  for (iVar3 = 0; iVar3 < (this->mask).super_ChLinkMask.nconstr; iVar3 = iVar3 + 1) {
    pCVar1 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,iVar3);
    if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar1 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,iVar3);
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar4 + off_L));
      (pCVar1->super_ChConstraintTwo).super_ChConstraint.l_i = *pdVar2;
      pCVar1 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,iVar3);
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar4 + off_L));
      iVar4 = iVar4 + 1;
      (pCVar1->super_ChConstraintTwo).super_ChConstraint.b_i = *pdVar2;
    }
  }
  iVar3 = (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
            super_ChObj._vptr_ChObj[0x19])(this);
  pCVar5 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_X)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_X)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_X)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  pCVar5 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Y)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_Y)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Y)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  pCVar5 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Z)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_Z)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Z)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  pCVar5 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Rx)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_Rx)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Rx)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  pCVar5 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Ry)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_Ry)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Ry)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  pCVar5 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Rz)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      iVar3 = iVar3 + 1;
      (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
      pCVar5 = (this->limit_Rz)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i = *pdVar2;
      pCVar5 = (this->limit_Rz)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
      pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                          (ulong)(iVar3 + off_L));
      (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.b_i = *pdVar2;
    }
  }
  return;
}

Assistant:

void ChLinkLock::IntToDescriptor(const unsigned int off_v,
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_l_i(L(off_L + cnt));
            mask.Constr_N(i).Set_b_i(Qc(off_L + cnt));
            cnt++;
        }
    }

    int local_offset = this->GetDOC_c();

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            limit_X->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_X->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_X->constr_upper.IsActive()) {
            limit_X->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_X->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            limit_Y->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Y->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Y->constr_upper.IsActive()) {
            limit_Y->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Y->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            limit_Z->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Z->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Z->constr_upper.IsActive()) {
            limit_Z->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Z->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            limit_Rx->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Rx->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Rx->constr_upper.IsActive()) {
            limit_Rx->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Rx->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            limit_Ry->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Ry->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Ry->constr_upper.IsActive()) {
            limit_Ry->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Ry->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            limit_Rz->constr_lower.Set_l_i(L(off_L + local_offset));
            limit_Rz->constr_lower.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
        if (limit_Rz->constr_upper.IsActive()) {
            limit_Rz->constr_upper.Set_l_i(L(off_L + local_offset));
            limit_Rz->constr_upper.Set_b_i(Qc(off_L + local_offset));
            ++local_offset;
        }
    }
}